

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool __thiscall QString::startsWith(QString *this,QLatin1StringView s,CaseSensitivity cs)

{
  QStringView haystack;
  QLatin1String needle;
  bool bVar1;
  qsizetype in_RDX;
  long in_FS_OFFSET;
  undefined4 unaff_retaddr;
  QString *in_stack_ffffffffffffffc8;
  QStringView *in_stack_ffffffffffffffd0;
  CaseSensitivity in_stack_ffffffffffffffd8;
  char *pcVar2;
  
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  QStringView::QStringView<QString,_true>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  haystack.m_size._4_4_ = cs;
  haystack.m_size._0_4_ = unaff_retaddr;
  haystack.m_data = (storage_type_conflict *)this;
  needle.m_data = pcVar2;
  needle.m_size = in_RDX;
  bVar1 = (anonymous_namespace)::qt_starts_with_impl<QStringView,QLatin1String>
                    (haystack,needle,in_stack_ffffffffffffffd8);
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QString::startsWith(QLatin1StringView s, Qt::CaseSensitivity cs) const
{
    return qt_starts_with_impl(QStringView(*this), s, cs);
}